

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_reservestack(HSQUIRRELVM v,SQInteger nsize)

{
  ulong uVar1;
  SQObject local_18;
  
  uVar1 = nsize + v->_top;
  if ((v->_stack)._size < uVar1) {
    if (v->_nmetamethodscall != 0) {
      sq_throwerror(v,"cannot resize stack while in a metamethod");
      return -1;
    }
    local_18._unVal.pTable = (SQTable *)0x0;
    local_18._type = OT_NULL;
    local_18._flags = '\0';
    local_18._5_3_ = 0;
    sqvector<SQObjectPtr,_unsigned_int>::resize
              (&v->_stack,(size_type)uVar1,(SQObjectPtr *)&local_18);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_18);
  }
  return 0;
}

Assistant:

SQRESULT sq_reservestack(HSQUIRRELVM v,SQInteger nsize)
{
    if (((SQUnsignedInteger)v->_top + nsize) > v->_stack.size()) {
        if(v->_nmetamethodscall) {
            return sq_throwerror(v,_SC("cannot resize stack while in a metamethod"));
        }
        v->_stack.resize(v->_stack.size() + ((v->_top + nsize) - v->_stack.size()));
    }
    return SQ_OK;
}